

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O2

uint cio_read(opj_cio_t *cio,int n)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  
  iVar1 = n * 8;
  uVar3 = 0;
  for (; iVar1 = iVar1 + -8, 0 < n; n = n + -1) {
    bVar2 = cio_bytein(cio);
    uVar3 = uVar3 + ((uint)bVar2 << ((byte)iVar1 & 0x1f));
  }
  return uVar3;
}

Assistant:

unsigned int cio_read(opj_cio_t *cio, int n) {
	int i;
	unsigned int v;
	v = 0;
	for (i = n - 1; i >= 0; i--) {
		v += cio_bytein(cio) << (i << 3);
	}
	return v;
}